

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

void decodeTriple(char *result,int *difx,int *dify)

{
  char cVar1;
  int iVar2;
  
  cVar1 = decodeChar_decode_chars[(byte)*result];
  if (cVar1 < 0x18) {
    iVar2 = decodeBase31(result + 1);
    *difx = iVar2 / 0x22 + (cVar1 % '\x06') * 0x1c;
    *dify = (cVar1 / '\x06') * 0x22 + iVar2 % 0x22;
  }
  else {
    iVar2 = decodeBase31(result + 1);
    *dify = iVar2 % 0x28 + 0x88;
    *difx = iVar2 / 0x28 + cVar1 * 0x18 + -0x240;
  }
  return;
}

Assistant:

static void decodeTriple(const char *result, int *difx, int *dify) {
    // decode the first character
    const int c1 = decodeChar(*result++);
    ASSERT(result);
    ASSERT(difx);
    ASSERT(dify);
    if (c1 < 24) {
        int m = decodeBase31(result);
        *difx = (c1 % 6) * 28 + (m / 34);
        *dify = (c1 / 6) * 34 + (m % 34);
    } else // bottom row
    {
        int x = decodeBase31(result);
        *dify = (x % 40) + 136;
        *difx = (x / 40) + 24 * (c1 - 24);
    }
}